

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_36::HttpClientAdapter::connect
          (HttpClientAdapter *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PromiseArena *pPVar1;
  long *plVar2;
  undefined8 *puVar3;
  PromiseBase PVar4;
  Disposer *node;
  size_t sVar5;
  AsyncIoStream *pAVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  HttpHeaderTable *pHVar9;
  undefined8 uVar10;
  WeakFulfiller<kj::HttpClient::ConnectRequest::Status> *params;
  StringPtr *pSVar11;
  size_t *psVar12;
  WeakFulfiller<void> *params_00;
  AsyncIoStreamWithGuards *this_00;
  void *pvVar13;
  HttpService *pHVar14;
  int __flags;
  undefined4 in_register_0000000c;
  long lVar15;
  AsyncIoStream *pAVar16;
  void *extraout_RDX;
  void *extraout_RDX_00;
  char *pcVar17;
  PromiseNode *ptrCopy_2;
  TransformPromiseNodeBase *this_01;
  long lVar18;
  undefined4 in_register_00000034;
  __fn *in_R8;
  __fn *__arg;
  undefined1 *in_R9;
  ConnectResponseImpl *ptrCopy;
  PromiseBase local_1a0;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  Refcounted *refcounted;
  PromiseBase local_180;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_178;
  String hostCopy;
  TwoWayPipe pipe;
  PromiseNode *ptrCopy_1;
  undefined1 local_118 [48];
  HttpHeaders *pHStack_e8;
  ArrayDisposer *local_e0;
  AsyncIoStreamWithGuards *pAStack_d8;
  undefined1 *local_b0;
  long local_a8;
  PromiseFulfillerPair<kj::HttpClient::ConnectRequest::Status> paf;
  HttpHeaderTable *local_88;
  WeakFulfillerBase *local_80;
  WeakFulfiller<void> *local_78;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> local_70;
  undefined1 local_40 [8];
  undefined8 local_38;
  
  local_a8 = CONCAT44(in_register_00000034,__fd);
  lVar15 = CONCAT44(in_register_0000000c,__len);
  lVar18 = lVar15;
  __arg = in_R8;
  heapString(&hostCopy,lVar15 - 1);
  __flags = (int)lVar18;
  pvVar13 = extraout_RDX;
  if (lVar15 - 1U != 0) {
    pcVar17 = (char *)hostCopy.content.size_;
    if (hostCopy.content.size_ != 0) {
      pcVar17 = hostCopy.content.ptr;
    }
    memcpy(pcVar17,__addr,lVar15 - 1U);
    pvVar13 = extraout_RDX_00;
  }
  HttpHeaders::clone((HttpHeaders *)local_118,in_R8,pvVar13,__flags,__arg);
  heap<kj::HttpHeaders>((kj *)&headersCopy,(HttpHeaders *)local_118);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_118);
  newTwoWayPipe();
  params = (WeakFulfiller<kj::HttpClient::ConnectRequest::Status> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>).super_PromiseRejector.
  _vptr_PromiseRejector = (_func_int **)&PTR_reject_006dc810;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006dc848;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::HttpClient::ConnectRequest::Status>&>
            ((PromiseDisposer *)local_118,params);
  uVar7 = local_118._0_8_;
  paf.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_118._0_8_;
  paf.fulfiller.disposer = &(params->super_WeakFulfillerBase).super_Disposer;
  paf.fulfiller.ptr = (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)params;
  pSVar11 = (StringPtr *)operator_new(0x50);
  pAVar6 = pipe.ends[0].ptr;
  paf.fulfiller.ptr = (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)0x0;
  pipe.ends[0].ptr = (AsyncIoStream *)0x0;
  psVar12 = &(pSVar11->content).size_;
  *(undefined4 *)&pSVar11[1].content.ptr = 0;
  (pSVar11->content).ptr = (char *)&PTR_accept_006d9d60;
  (pSVar11->content).size_ = (size_t)&PTR_disposeImpl_006d9d90;
  pSVar11[1].content.size_ = (size_t)&params->super_WeakFulfillerBase;
  pSVar11[2].content.ptr = (char *)params;
  local_b0 = in_R9;
  params_00 = (WeakFulfiller<void> *)operator_new(0x18);
  (params_00->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params_00->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006b66f0;
  (params_00->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006b6728;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)local_118,params_00);
  uVar8 = local_118._0_8_;
  local_88 = (HttpHeaderTable *)local_118._0_8_;
  local_70.ptr._0_8_ = local_70.ptr._0_8_ & 0xffffffffffffff00;
  local_80 = &params_00->super_WeakFulfillerBase;
  local_78 = params_00;
  this_00 = (AsyncIoStreamWithGuards *)operator_new(0x88);
  local_178.disposer = pipe.ends[0].disposer;
  local_178.ptr = pAVar6;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
            ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)local_118,
             &local_70);
  Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::Promise
            ((Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *)
             &local_1a0,
             (FixVoid<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *)
             local_118);
  local_180.node.ptr = (OwnPromiseNode)(OwnPromiseNode)uVar8;
  local_88 = (HttpHeaderTable *)0x0;
  AsyncIoStreamWithGuards::AsyncIoStreamWithGuards
            (this_00,&local_178,
             (Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *)
             &local_1a0,(Promise<void> *)&local_180);
  PVar4.node.ptr = local_180.node.ptr;
  if (local_180.node.ptr != (PromiseNode *)0x0) {
    local_180.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar4.node.ptr);
  }
  PVar4.node.ptr = local_1a0.node.ptr;
  if (local_1a0.node.ptr != (PromiseNode *)0x0) {
    local_1a0.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar4.node.ptr);
  }
  if ((local_118[0] == (PromiseDisposer)0x1) && ((StringPtr *)local_118._8_8_ != (StringPtr *)0x0))
  {
    (***(_func_int ***)local_118._24_8_)
              (local_118._24_8_,local_118._8_8_,1,local_118._16_8_,local_118._16_8_,0);
  }
  if (local_178.ptr != (AsyncIoStream *)0x0) {
    (**(local_178.disposer)->_vptr_Disposer)
              (local_178.disposer,
               ((local_178.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&((local_178.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  uVar10 = local_70.ptr.field_1.value.buffer.size_;
  uVar8 = local_70.ptr.field_1.value.buffer.ptr;
  if ((local_70.ptr.isSet == true) && (local_70.ptr.field_1.value.buffer.ptr != (uchar *)0x0)) {
    local_70.ptr.field_1.value.buffer.ptr = (uchar *)0x0;
    local_70.ptr.field_1.value.buffer.size_ = 0;
    (**(local_70.ptr.field_1.value.buffer.disposer)->_vptr_ArrayDisposer)
              (local_70.ptr.field_1.value.buffer.disposer,uVar8,1,uVar10,uVar10,0);
  }
  pSVar11[2].content.size_ = (size_t)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
  pSVar11[3].content.ptr = (char *)this_00;
  pSVar11[3].content.size_ = (size_t)&params_00->super_WeakFulfillerBase;
  pSVar11[4].content.ptr = (char *)params_00;
  *(undefined1 *)&pSVar11[4].content.size_ = 1;
  *(int *)&pSVar11[1].content.ptr = *(int *)&pSVar11[1].content.ptr + 2;
  local_e0 = (ArrayDisposer *)operator_new(0x28);
  local_e0[1]._vptr_ArrayDisposer = (_func_int **)psVar12;
  local_e0[2]._vptr_ArrayDisposer = (_func_int **)pSVar11;
  local_e0[3]._vptr_ArrayDisposer =
       (_func_int **)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
  local_e0[4]._vptr_ArrayDisposer = (_func_int **)this_00;
  pSVar11[3].content.ptr = (char *)0x0;
  local_e0->_vptr_ArrayDisposer = (_func_int **)&PTR_disposeImpl_006d9df0;
  pcVar17 = hostCopy.content.ptr;
  if (hostCopy.content.size_ == 0) {
    pcVar17 = "";
  }
  local_40[0] = *local_b0;
  local_38 = *(undefined8 *)(local_b0 + 8);
  (**(code **)(**(long **)(local_a8 + 8) + 8))
            (&local_1a0,*(long **)(local_a8 + 8),pcVar17,
             hostCopy.content.size_ + (hostCopy.content.size_ == 0),headersCopy.ptr,this_00,pSVar11,
             local_40);
  PVar4.node.ptr = local_1a0.node.ptr;
  local_118._16_8_ = hostCopy.content.ptr;
  local_118._24_8_ = hostCopy.content.size_;
  local_118._32_8_ = hostCopy.content.disposer;
  hostCopy.content.ptr = (char *)0x0;
  hostCopy.content.size_ = 0;
  local_118._40_8_ = headersCopy.disposer;
  pHStack_e8 = headersCopy.ptr;
  headersCopy.ptr = (HttpHeaders *)0x0;
  pPVar1 = *(PromiseArena **)((long)local_1a0.node.ptr + 8);
  local_118._0_8_ = psVar12;
  local_118._8_8_ = pSVar11;
  pAStack_d8 = this_00;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_1a0.node.ptr - (long)pPVar1) < 0x70) {
    pvVar13 = operator_new(0x400);
    this_01 = (TransformPromiseNodeBase *)((long)pvVar13 + 0x390);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_1a0.node,kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar13 + 0x390) = &PTR_destroy_006d9e70;
    *(undefined8 *)((long)pvVar13 + 0x3b8) = local_118._0_8_;
    *(undefined8 *)((long)pvVar13 + 0x3c0) = local_118._8_8_;
    *(undefined8 *)((long)pvVar13 + 0x3c8) = local_118._16_8_;
    *(undefined8 *)((long)pvVar13 + 0x3d0) = local_118._24_8_;
    *(undefined8 *)((long)pvVar13 + 0x3d8) = local_118._32_8_;
    *(undefined8 *)((long)pvVar13 + 0x3e0) = local_118._40_8_;
    *(HttpHeaders **)((long)pvVar13 + 1000) = pHStack_e8;
    *(ArrayDisposer **)((long)pvVar13 + 0x3f0) = local_e0;
    *(AsyncIoStreamWithGuards **)((long)pvVar13 + 0x3f8) = pAStack_d8;
    *(void **)((long)pvVar13 + 0x398) = pvVar13;
  }
  else {
    *(PromiseArena **)((long)local_1a0.node.ptr + 8) = (PromiseArena *)0x0;
    this_01 = (TransformPromiseNodeBase *)((long)local_1a0.node.ptr + -0x70);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_1a0.node,kj::_::IdentityFunc<void>::operator());
    ((PromiseArenaMember *)((long)PVar4.node.ptr + -0x70))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006d9e70;
    *(undefined8 *)((long)PVar4.node.ptr + -0x48) = local_118._0_8_;
    ((PromiseArenaMember *)((long)PVar4.node.ptr + -0x40))->_vptr_PromiseArenaMember =
         (_func_int **)local_118._8_8_;
    *(undefined8 *)((long)PVar4.node.ptr + -0x38) = local_118._16_8_;
    ((PromiseArenaMember *)((long)PVar4.node.ptr + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)local_118._24_8_;
    *(undefined8 *)((long)PVar4.node.ptr + -0x28) = local_118._32_8_;
    ((PromiseArenaMember *)((long)PVar4.node.ptr + -0x20))->_vptr_PromiseArenaMember =
         (_func_int **)local_118._40_8_;
    *(HttpHeaders **)((long)PVar4.node.ptr + -0x18) = pHStack_e8;
    ((PromiseArenaMember *)((long)PVar4.node.ptr + -0x10))->_vptr_PromiseArenaMember =
         (_func_int **)local_e0;
    *(AsyncIoStreamWithGuards **)((long)PVar4.node.ptr + -8) = pAStack_d8;
    *(PromiseArena **)((long)PVar4.node.ptr + -0x68) = pPVar1;
  }
  pAStack_d8 = (AsyncIoStreamWithGuards *)0x0;
  pHStack_e8 = (HttpHeaders *)0x0;
  local_118._24_8_ = (ArrayDisposer *)0x0;
  local_118._16_8_ = 0;
  local_118._8_8_ = (StringPtr *)0x0;
  local_70.ptr._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_70.ptr.field_1.value.buffer.ptr = "connect";
  local_70.ptr.field_1.value.buffer.size_ = 0x1400001a7b;
  local_178.disposer = (Disposer *)this_01;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_88,(OwnPromiseNode *)&local_178,(SourceLocation *)&local_70);
  pHVar9 = local_88;
  node = local_178.disposer;
  if ((TransformPromiseNodeBase *)local_178.disposer != (TransformPromiseNodeBase *)0x0) {
    local_178.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  (anonymous_namespace)::HttpClientAdapter::
  connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda(kj::Exception&&)#1}
  ::~Exception((_lambda_kj__Exception____1_ *)local_118);
  PVar4.node.ptr = local_1a0.node.ptr;
  if (local_1a0.node.ptr != (PromiseNode *)0x0) {
    local_1a0.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar4.node.ptr);
  }
  pAVar6 = pipe.ends[1].ptr;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)uVar7;
  paf.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  pHVar14 = (HttpService *)operator_new(0x20);
  pHVar14[1]._vptr_HttpService = (_func_int **)pHVar9;
  pHVar14[2]._vptr_HttpService = (_func_int **)pipe.ends[1].disposer;
  pHVar14[3]._vptr_HttpService = (_func_int **)pipe.ends[1].ptr;
  pipe.ends[1].ptr = (AsyncIoStream *)0x0;
  pAVar16 = (AsyncIoStream *)0x1;
  if (pAVar6 != (AsyncIoStream *)0x0) {
    pAVar16 = pAVar6;
  }
  pHVar14->_vptr_HttpService = (_func_int **)&PTR_disposeImpl_006dc970;
  this->service = pHVar14;
  this[1].super_HttpClient._vptr_HttpClient = (_func_int **)pAVar16;
  lVar18 = 0x10;
  do {
    plVar2 = *(long **)((long)&pipe.ends[0].ptr + lVar18);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)&pipe.ends[0].ptr + lVar18) = 0;
      puVar3 = *(undefined8 **)((long)&pipe.ends[0].disposer + lVar18);
      (**(code **)*puVar3)(puVar3,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    lVar18 = lVar18 + -0x10;
  } while (lVar18 != -0x10);
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
  }
  sVar5 = hostCopy.content.size_;
  pcVar17 = hostCopy.content.ptr;
  if (hostCopy.content.ptr != (char *)0x0) {
    hostCopy.content.ptr = (char *)0x0;
    hostCopy.content.size_ = 0;
    (**(hostCopy.content.disposer)->_vptr_ArrayDisposer)
              (hostCopy.content.disposer,pcVar17,1,sVar5,sVar5,0);
  }
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    // We have to clone the host and the headers because HttpServer implementation are allowed to
    // assusme that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call.
    auto hostCopy = kj::str(host);
    auto headersCopy = kj::heap(headers.clone());

    // 1. Create a new TwoWayPipe, one will be returned with the ConnectRequest,
    //    the other will be held by the ConnectResponseImpl.
    auto pipe = kj::newTwoWayPipe();

    // 2. Create a promise/fulfiller pair for the status. The promise will be
    //    returned with the ConnectResponse, the fulfiller will be held by the
    //    ConnectResponseImpl.
    auto paf = kj::newPromiseAndFulfiller<ConnectRequest::Status>();

    // 3. Create the ConnectResponseImpl
    auto response = kj::refcounted<ConnectResponseImpl>(kj::mv(paf.fulfiller),
                                                        kj::mv(pipe.ends[0]));

    // 5. Call service.connect, passing in the tunnel.
    //    The call to tunnel->getConnectStream() returns a guarded stream that will buffer
    //    writes until the status is indicated by calling accept/reject.
    auto connectStream = response->getConnectStream();
    auto promise = service.connect(hostCopy, *headersCopy, *connectStream, *response, settings)
        .eagerlyEvaluate([response=kj::mv(response),
                          host=kj::mv(hostCopy),
                          headers=kj::mv(headersCopy),
                          connectStream=kj::mv(connectStream)](kj::Exception&& ex) mutable {
      // A few things need to happen here.
      //   1. We'll log the exception.
      //   2. We'll break the pipe.
      //   3. We'll reject the status promise if it is still pending.
      //
      // We'll do all of this within the ConnectResponseImpl, however, since it
      // maintains the state necessary here.
      response->handleException(kj::mv(ex), kj::mv(connectStream));
    });

    // TODO(bug): There's a challenge with attaching the service.connect promise to the
    // connection stream below in that the client will likely drop the connection as soon
    // as it reads EOF, but the promise representing the service connect() call may still
    // be running and want to do some cleanup after it has sent EOF. That cleanup will be
    // canceled. For regular HTTP calls, DelayedEofInputStream was created to address this
    // exact issue but with connect() being bidirectional it's rather more difficult. We
    // want a delay similar to what DelayedEofInputStream adds but only when both directions
    // have been closed. That currently is not possible until we have an alternative to
    // shutdownWrite() that returns a Promise (e.g. Promise<void> end()). For now, we can
    // live with the current limitation.
    return ConnectRequest {
      kj::mv(paf.promise),
      pipe.ends[1].attach(kj::mv(promise)),
    };
  }